

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Token keyword;
  Token star1;
  Token doubleColon;
  Token star2;
  Token semi;
  PackageExportAllDeclarationSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (PackageExportAllDeclarationSyntax *)allocate(this,0x90,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  star1.kind = args_2->kind;
  star1._2_1_ = args_2->field_0x2;
  star1.numFlags.raw = (args_2->numFlags).raw;
  star1.rawLen = args_2->rawLen;
  star1.info = args_2->info;
  doubleColon.kind = args_3->kind;
  doubleColon._2_1_ = args_3->field_0x2;
  doubleColon.numFlags.raw = (args_3->numFlags).raw;
  doubleColon.rawLen = args_3->rawLen;
  doubleColon.info = args_3->info;
  star2.kind = args_4->kind;
  star2._2_1_ = args_4->field_0x2;
  star2.numFlags.raw = (args_4->numFlags).raw;
  star2.rawLen = args_4->rawLen;
  star2.info = args_4->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::PackageExportAllDeclarationSyntax::PackageExportAllDeclarationSyntax
            (this_00,args,keyword,star1,doubleColon,star2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }